

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builderutil_snap_functions.cc
# Opt level: O3

S2Point * __thiscall
s2builderutil::IntLatLngSnapFunction::SnapPoint
          (S2Point *__return_storage_ptr__,IntLatLngSnapFunction *this,S2Point *point)

{
  S2LatLng input;
  double local_38;
  ostream *local_30;
  S2LatLng local_28;
  
  if (-1 < this->exponent_) {
    S2LatLng::S2LatLng((S2LatLng *)&local_38,point);
    local_28.coords_.c_[0] =
         (double)(long)ROUND(local_38 * 57.29577951308232 * this->from_degrees_) * this->to_degrees_
         * 0.017453292519943295;
    local_28.coords_.c_[1] =
         (double)(long)ROUND((double)local_30 * 57.29577951308232 * this->from_degrees_) *
         this->to_degrees_ * 0.017453292519943295;
    S2LatLng::ToPoint(__return_storage_ptr__,&local_28);
    return __return_storage_ptr__;
  }
  S2LogMessage::S2LogMessage
            ((S2LogMessage *)&local_38,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builderutil_snap_functions.cc"
             ,0x157,kFatal,(ostream *)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_30,"Check failed: (exponent_) >= (0) ",0x21);
  abort();
}

Assistant:

S2Point IntLatLngSnapFunction::SnapPoint(const S2Point& point) const {
  S2_DCHECK_GE(exponent_, 0);  // Make sure the snap function was initialized.
  S2LatLng input(point);
  int64 lat = MathUtil::FastInt64Round(input.lat().degrees() * from_degrees_);
  int64 lng = MathUtil::FastInt64Round(input.lng().degrees() * from_degrees_);
  return S2LatLng::FromDegrees(lat * to_degrees_, lng * to_degrees_).ToPoint();
}